

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O0

bool __thiscall
mp::
BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinhId>_>
::InitPeriodic(BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinhId>_>
               *this)

{
  PLApproxParams *pPVar1;
  ulong uVar2;
  reference pvVar3;
  BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinhId>_>
  *in_RDI;
  bool bVar4;
  double dVar5;
  double dVar6;
  double in_XMM1_Qa;
  Range per;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff90;
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff98;
  Range local_58;
  Range local_48;
  double local_38;
  undefined1 local_28 [40];
  
  uVar2 = (*(code *)(((_Vector_base<double,_std::allocator<double>_> *)
                     &in_RDI->_vptr_BasicPLApproximator)->_M_impl).super__Vector_impl_data._M_start
                    [6])();
  bVar4 = (uVar2 & 1) != 0;
  if (bVar4) {
    (*(code *)(((_Vector_base<double,_std::allocator<double>_> *)&in_RDI->_vptr_BasicPLApproximator)
              ->_M_impl).super__Vector_impl_data._M_start[8])(local_28);
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)in_RDI,in_stack_ffffffffffffff98);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_RDI);
    local_38 = (double)(*(code *)(((_Vector_base<double,_std::allocator<double>_> *)
                                  &in_RDI->_vptr_BasicPLApproximator)->_M_impl).
                                 super__Vector_impl_data._M_start[7])();
    in_RDI->laPrm_->fUsePeriod = true;
    in_RDI->laPrm_->periodLength = in_XMM1_Qa - local_38;
    pvVar3 = std::vector<double,_std::allocator<double>_>::front(in_stack_ffffffffffffff90);
    this_00 = (vector<double,_std::allocator<double>_> *)*pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::back(this_00);
    Range::Range(&local_48,(double)this_00,*pvVar3);
    pPVar1 = in_RDI->laPrm_;
    (pPVar1->periodRemainderRange).lb = local_48.lb;
    (pPVar1->periodRemainderRange).ub = local_48.ub;
    dVar5 = lbx(in_RDI);
    dVar5 = floor((dVar5 - local_38) / in_RDI->laPrm_->periodLength);
    dVar6 = ubx(in_RDI);
    dVar6 = ceil((dVar6 - local_38) / in_RDI->laPrm_->periodLength);
    Range::Range(&local_58,dVar5,dVar6);
    pPVar1 = in_RDI->laPrm_;
    (pPVar1->periodicFactorRange).lb = local_58.lb;
    (pPVar1->periodicFactorRange).ub = local_58.ub;
  }
  return bVar4;
}

Assistant:

bool BasicPLApproximator<FuncCon>::InitPeriodic() {
  if (IsPeriodic()) {

    breakpoints_ = GetDefaultBreakpoints();

    auto per = GetDefaultPeriod();

    laPrm_.fUsePeriod = true;
    laPrm_.periodLength = per.ub - per.lb;
    laPrm_.periodRemainderRange =
      {breakpoints_.front(), breakpoints_.back()};
    laPrm_.periodicFactorRange = {
      std::floor( (lbx()-per.lb) / laPrm_.periodLength ),
      std::ceil( (ubx()-per.lb) / laPrm_.periodLength )
    };

    return true;
  }
  return false;
}